

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrespondent.c
# Opt level: O1

int nn_xrespondent_send(nn_sockbase *self,nn_msg *msg)

{
  uint32_t uVar1;
  uint uVar2;
  size_t sVar3;
  uint8_t *buf;
  nn_hash_item *pnVar4;
  void *pvVar5;
  nn_msg *msg_00;
  ulong uVar6;
  nn_list_item **ppnVar7;
  nn_pipe *apnStack_68 [5];
  nn_msg *pnStack_40;
  
  sVar3 = nn_chunkref_size(&msg->sphdr);
  if (3 < sVar3) {
    buf = (uint8_t *)nn_chunkref_data(&msg->sphdr);
    uVar1 = nn_getl(buf);
    nn_chunkref_trim(&msg->sphdr,4);
    pnVar4 = nn_hash_get((nn_hash *)&self[1].sock,uVar1);
    if (pnVar4 == (nn_hash_item *)0x0) {
      ppnVar7 = (nn_list_item **)0x0;
    }
    else {
      pnVar4 = nn_hash_get((nn_hash *)&self[1].sock,uVar1);
      ppnVar7 = &pnVar4[-1].list.prev;
    }
    if ((ppnVar7 != (nn_list_item **)0x0) && ((*(byte *)(ppnVar7 + 8) & 1) != 0)) {
      msg_00 = msg;
      uVar2 = nn_pipe_send((nn_pipe *)*ppnVar7,msg);
      if (-1 < (int)uVar2) {
        if ((uVar2 & 1) == 0) {
          return 0;
        }
        *(byte *)(ppnVar7 + 8) = *(byte *)(ppnVar7 + 8) & 0xfe;
        return 0;
      }
      uVar6 = (ulong)uVar2;
      nn_xrespondent_send_cold_1();
      pnStack_40 = msg;
      uVar2 = nn_fq_recv((nn_fq *)(uVar6 + 0x28),msg_00,apnStack_68);
      if (-1 < (int)uVar2) {
        if ((uVar2 & 2) == 0) {
          pvVar5 = nn_chunkref_data(&msg_00->body);
          sVar3 = nn_chunkref_size(&msg_00->body);
          uVar6 = 0;
          do {
            if (sVar3 < uVar6 + 4) {
              nn_msg_term(msg_00);
              return -0xb;
            }
            uVar1 = nn_getl((uint8_t *)(uVar6 + (long)pvVar5));
            uVar6 = uVar6 + 4;
          } while (-1 < (int)uVar1);
          sVar3 = nn_chunkref_size(&msg_00->sphdr);
          if (sVar3 != 0) {
            nn_xrespondent_recv_cold_1();
            return -0x5c;
          }
          nn_xrespondent_recv_cold_2();
        }
        nn_xrespondent_recv_cold_3();
        uVar2 = 0;
      }
      return uVar2;
    }
  }
  nn_msg_term(msg);
  return 0;
}

Assistant:

int nn_xrespondent_send (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    uint32_t key;
    struct nn_xrespondent *xrespondent;
    struct nn_xrespondent_data *data;

    xrespondent = nn_cont (self, struct nn_xrespondent, sockbase);

    /*  We treat invalid peer ID as if the peer was non-existent. */
    if (nn_slow (nn_chunkref_size (&msg->sphdr) < sizeof (uint32_t))) {
        nn_msg_term (msg);
        return 0;
    }

    /*  Retrieve destination peer ID. Trim it from the header. */
    key = nn_getl (nn_chunkref_data (&msg->sphdr));
    nn_chunkref_trim (&msg->sphdr, 4);

    /*  Find the appropriate pipe to send the message to. If there's none,
        or if it's not ready for sending, silently drop the message. */
    data = nn_cont (nn_hash_get (&xrespondent->outpipes, key),
        struct nn_xrespondent_data, outitem);
    if (!data || !(data->flags & NN_XRESPONDENT_OUT)) {
        nn_msg_term (msg);
        return 0;
    }

    /*  Send the message. */
    rc = nn_pipe_send (data->pipe, msg);
    errnum_assert (rc >= 0, -rc);
    if (rc & NN_PIPE_RELEASE)
        data->flags &= ~NN_XRESPONDENT_OUT;

    return 0;
}